

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryMLT.hpp
# Opt level: O0

bool __thiscall
ddd::DictionaryMLT<true,_false>::insert_key
          (DictionaryMLT<false,_false> *this,char *key,uint32_t value)

{
  undefined1 uVar1;
  bool bVar2;
  uint32_t uVar3;
  char *pcVar4;
  uint32_t in_EDX;
  char *in_RSI;
  long in_RDI;
  uint32_t suffix_id;
  Query query;
  undefined4 in_stack_ffffffffffffff90;
  uint32_t in_stack_ffffffffffffff94;
  DaTrie<true,_false,_false> *this_00;
  undefined7 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  undefined1 local_38 [16];
  DictionaryMLT<false,_false> *in_stack_ffffffffffffffd8;
  bool local_1;
  
  if ((int)in_EDX < 0) {
    __assert_fail("(value >> 31) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kampersanda[P]ddd/include/DictionaryMLT.hpp"
                  ,0x40,
                  "virtual bool ddd::DictionaryMLT<true, false>::insert_key(const char *, uint32_t) [WithBLM = true, WithNLM = false]"
                 );
  }
  this_00 = (DaTrie<true,_false,_false> *)local_38;
  Query::Query((Query *)this_00,in_RSI);
  std::
  unique_ptr<ddd::DaTrie<true,_false,_true>,_std::default_delete<ddd::DaTrie<true,_false,_true>_>_>
  ::operator->((unique_ptr<ddd::DaTrie<false,_false,_true>,_std::default_delete<ddd::DaTrie<false,_false,_true>_>_>
                *)0x18811b);
  uVar1 = DaTrie<true,_false,_true>::search_prefix
                    ((DaTrie<true,_false,_true> *)
                     CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                     (Query *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  if (!(bool)uVar1) {
    pcVar4 = Query::key((Query *)local_38);
    if (*pcVar4 == '\0') {
      Query::set_value((Query *)local_38,in_EDX);
    }
    else {
      in_stack_ffffffffffffff94 = new_suffix_id_(in_stack_ffffffffffffffd8);
      Query::set_value((Query *)local_38,in_stack_ffffffffffffff94);
    }
    std::
    unique_ptr<ddd::DaTrie<true,_false,_true>,_std::default_delete<ddd::DaTrie<true,_false,_true>_>_>
    ::operator->((unique_ptr<ddd::DaTrie<false,_false,_true>,_std::default_delete<ddd::DaTrie<false,_false,_true>_>_>
                  *)0x1881a7);
    DaTrie<true,_false,_true>::insert_prefix_leaf
              ((DaTrie<true,_false,_true> *)CONCAT17(uVar1,in_stack_ffffffffffffffa0),
               (Query *)this_00);
    bVar2 = Query::is_finished((Query *)local_38);
    if (bVar2) {
      *(long *)(in_RDI + 0x30) = *(long *)(in_RDI + 0x30) + 1;
      local_1 = true;
      goto LAB_0018827a;
    }
  }
  uVar3 = Query::value((Query *)local_38);
  Query::set_node_pos((Query *)local_38,0);
  Query::set_value((Query *)local_38,in_EDX);
  std::
  vector<std::unique_ptr<ddd::DaTrie<true,_false,_false>,_std::default_delete<ddd::DaTrie<true,_false,_false>_>_>,_std::allocator<std::unique_ptr<ddd::DaTrie<true,_false,_false>,_std::default_delete<ddd::DaTrie<true,_false,_false>_>_>_>_>
  ::operator[]((vector<std::unique_ptr<ddd::DaTrie<true,_false,_false>,_std::default_delete<ddd::DaTrie<true,_false,_false>_>_>,_std::allocator<std::unique_ptr<ddd::DaTrie<true,_false,_false>,_std::default_delete<ddd::DaTrie<true,_false,_false>_>_>_>_>
                *)(in_RDI + 0x10),(ulong)uVar3);
  std::
  unique_ptr<ddd::DaTrie<true,_false,_false>,_std::default_delete<ddd::DaTrie<true,_false,_false>_>_>
  ::operator->((unique_ptr<ddd::DaTrie<true,_false,_false>,_std::default_delete<ddd::DaTrie<true,_false,_false>_>_>
                *)0x188231);
  bVar2 = DaTrie<true,_false,_false>::insert_key
                    (this_00,(Query *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90))
  ;
  if (bVar2) {
    *(long *)(in_RDI + 0x30) = *(long *)(in_RDI + 0x30) + 1;
    local_1 = true;
  }
  else {
    local_1 = false;
  }
LAB_0018827a:
  Query::~Query((Query *)local_38);
  return local_1;
}

Assistant:

bool insert_key(const char* key, uint32_t value) {
    assert((value >> 31) == 0);

    Query query(key);

    if (!prefix_subtrie_->search_prefix(query)) {
      if (*query.key() != '\0') {
        query.set_value(new_suffix_id_());
      } else {
        query.set_value(value);
      }

      prefix_subtrie_->insert_prefix_leaf(query);

      if (query.is_finished()) {
        ++num_keys_;
        return true;
      }
    }

    auto suffix_id = query.value();
    query.set_node_pos(ROOT_POS);
    query.set_value(value);

    if (!suffix_subtries_[suffix_id]->insert_key(query)) {
      return false;
    }

    ++num_keys_;
    return true;
  }